

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

bool __thiscall tl::CStrT<char>::operator==(CStrT<char> *this,char *o)

{
  char *local_30;
  char *b;
  char *a;
  char *o_local;
  CStrT<char> *this_local;
  
  b = this->_str;
  local_30 = o;
  while( true ) {
    if (*b != *local_30) {
      return false;
    }
    if (*b == '\0') break;
    b = b + 1;
    local_30 = local_30 + 1;
  }
  return true;
}

Assistant:

bool CStrT<CharT>::operator==(const CharT* o)const
{
    const CharT* a = _str;
    const CharT* b = o;
    while(true) {
        if(*a != *b)
            return false;
        if(*a == 0)
            return true;
        a++;
        b++;
    }
}